

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool executeUpdate(UpdateStatement *stmt,
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                  *table_list,bool check)

{
  char *__s;
  bool bVar1;
  bool bVar2;
  table *this;
  size_t sVar3;
  allocator local_69;
  string local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
  local_48;
  
  if (stmt->table->type != kTableName) {
    return false;
  }
  std::__cxx11::string::string((string *)&local_68,stmt->table->name,&local_69);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
  ::_Rb_tree(&local_48,&table_list->_M_t);
  this = util::getTable(&local_68,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                         *)&local_48);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
  ::~_Rb_tree(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (this == (table *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"did not find table ",0x13);
    __s = stmt->table->name;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12d270);
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," from database",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
    bVar2 = false;
  }
  else {
    if (check) {
      bVar2 = table::updatecheck(this,stmt);
    }
    else {
      bVar2 = table::update(this,stmt);
    }
    if (bVar2 == false) {
      bVar1 = true;
      bVar2 = false;
      goto LAB_00114440;
    }
    bVar2 = true;
  }
  bVar1 = false;
LAB_00114440:
  if (bVar1) {
    return false;
  }
  return bVar2;
}

Assistant:

bool executeUpdate(hsql::UpdateStatement *stmt, map<string, table*> &table_list, bool check){
    if(stmt->table->type == hsql::kTableName) {
        table *totable = util::getTable(stmt->table->name, table_list);
        if (totable == NULL) {
            cout << "did not find table " << stmt->table->name << " from database" << endl;
            return false;
        }
        if(totable != nullptr){
            if(!check){
                if(totable->update(stmt)){
                    //cout << "update successful" << endl;

                    return true;
                }
            } else{
                if(totable->updatecheck(stmt)){
                    return true;
                }
            }


        }
    }
    //cout << "update false"<<endl;
    return false;
}